

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O3

_Bool Hacl_P256_ecdsa_verif_p256_sha2
                (uint32_t msg_len,uint8_t *msg,uint8_t *public_key,uint8_t *signature_r,
                uint8_t *signature_s)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t t1;
  ulong uVar8;
  uint8_t mHash [32];
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  Hacl_Hash_SHA2_hash_256((uint8_t *)&local_78,msg,msg_len);
  uVar8 = uStack_60 >> 0x38 | (uStack_60 & 0xff000000000000) >> 0x28 |
          (uStack_60 & 0xff0000000000) >> 0x18 | (uStack_60 & 0xff00000000) >> 8 |
          (uStack_60 & 0xff000000) << 8 | (uStack_60 & 0xff0000) << 0x18 |
          (uStack_60 & 0xff00) << 0x28 | uStack_60 << 0x38;
  uVar5 = local_68 >> 0x38 | (local_68 & 0xff000000000000) >> 0x28 |
          (local_68 & 0xff0000000000) >> 0x18 | (local_68 & 0xff00000000) >> 8 |
          (local_68 & 0xff000000) << 8 | (local_68 & 0xff0000) << 0x18 | (local_68 & 0xff00) << 0x28
          | local_68 << 0x38;
  uVar6 = uStack_70 >> 0x38 | (uStack_70 & 0xff000000000000) >> 0x28 |
          (uStack_70 & 0xff0000000000) >> 0x18 | (uStack_70 & 0xff00000000) >> 8 |
          (uStack_70 & 0xff000000) << 8 | (uStack_70 & 0xff0000) << 0x18 |
          (uStack_70 & 0xff00) << 0x28 | uStack_70 << 0x38;
  uVar7 = local_78 >> 0x38 | (local_78 & 0xff000000000000) >> 0x28 |
          (local_78 & 0xff0000000000) >> 0x18 | (local_78 & 0xff00000000) >> 8 |
          (local_78 & 0xff000000) << 8 | (local_78 & 0xff0000) << 0x18 | (local_78 & 0xff00) << 0x28
          | local_78 << 0x38;
  uVar1 = (ulong)(uVar5 < 0xbce6faada7179e84 ||
                 uVar5 + 0x4319055258e8617c < (ulong)(uVar8 < 0xf3b9cac2fc632551));
  uVar2 = (ulong)(uVar6 != 0xffffffffffffffff || uVar6 + 1 < uVar1);
  uVar4 = FStar_UInt64_eq_mask((ulong)(uVar7 < 0xffffffff00000000 || uVar7 + 0x100000000 < uVar2),0)
  ;
  local_58 = (uVar8 + 0xc46353d039cdaaf ^ uVar8) & uVar4 ^ uVar8;
  local_50 = ((uVar5 + 0x4319055258e8617c) - (ulong)(uVar8 < 0xf3b9cac2fc632551) ^ uVar5) & uVar4 ^
             uVar5;
  local_48 = ((uVar6 + 1) - uVar1 ^ uVar6) & uVar4 ^ uVar6;
  local_40 = ((uVar7 + 0x100000000) - uVar2 ^ uVar7) & uVar4 ^ uVar7;
  _Var3 = ecdsa_verify_msg_as_qelem(&local_58,public_key,signature_r,signature_s);
  return _Var3;
}

Assistant:

bool
Hacl_P256_ecdsa_verif_p256_sha2(
  uint32_t msg_len,
  uint8_t *msg,
  uint8_t *public_key,
  uint8_t *signature_r,
  uint8_t *signature_s
)
{
  uint64_t m_q[4U] = { 0U };
  uint8_t mHash[32U] = { 0U };
  Hacl_Hash_SHA2_hash_256(mHash, msg, msg_len);
  KRML_MAYBE_UNUSED_VAR(msg_len);
  uint8_t *mHash32 = mHash;
  bn_from_bytes_be4(m_q, mHash32);
  qmod_short(m_q, m_q);
  bool res = ecdsa_verify_msg_as_qelem(m_q, public_key, signature_r, signature_s);
  return res;
}